

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry
          (ParameterizedTestCaseRegistry *this)

{
  pointer ppPVar1;
  
  ppPVar1 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 !=
      (this->test_case_infos_).
      super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (*ppPVar1 != (ParameterizedTestCaseInfoBase *)0x0) {
        (**(code **)(*(long *)*ppPVar1 + 8))();
      }
      ppPVar1 = ppPVar1 + 1;
    } while (ppPVar1 !=
             (this->test_case_infos_).
             super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  ppPVar1 = (this->test_case_infos_).
            super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppPVar1 != (pointer)0x0) {
    operator_delete(ppPVar1,(long)(this->test_case_infos_).
                                  super__Vector_base<testing::internal::ParameterizedTestCaseInfoBase_*,_std::allocator<testing::internal::ParameterizedTestCaseInfoBase_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppPVar1
                   );
    return;
  }
  return;
}

Assistant:

~ParameterizedTestCaseRegistry() {
    for (TestCaseInfoContainer::iterator it = test_case_infos_.begin();
         it != test_case_infos_.end(); ++it) {
      delete *it;
    }
  }